

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O0

void __thiscall BitStreamReader::skipBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  BitStreamException *this_00;
  uint num_local;
  BitStreamReader *this_local;
  
  if ((this->super_BitStream).m_totalBits < num) {
    this_00 = (BitStreamException *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    BitStreamException::BitStreamException(this_00);
    __cxa_throw(this_00,&BitStreamException::typeinfo,BitStreamException::~BitStreamException);
  }
  if (num < 0x21) {
    if (this->m_bitLeft < num) {
      (this->super_BitStream).m_buffer = (this->super_BitStream).m_buffer + 1;
      uVar1 = getCurVal(this,(this->super_BitStream).m_buffer);
      this->m_curVal = uVar1;
      this->m_bitLeft = (0x20 - num) + this->m_bitLeft;
    }
    else {
      this->m_bitLeft = this->m_bitLeft - num;
    }
    (this->super_BitStream).m_totalBits = (this->super_BitStream).m_totalBits - num;
    return;
  }
  __assert_fail("num <= INT_BIT",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/bitStream.h"
                ,0x78,"void BitStreamReader::skipBits(const unsigned int)");
}

Assistant:

void skipBits(const unsigned num)
    {
        if (m_totalBits < num)
            THROW_BITSTREAM_ERR;
        assert(num <= INT_BIT);
        if (num <= m_bitLeft)
            m_bitLeft -= num;
        else
        {
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft += INT_BIT - num;
        }
        m_totalBits -= num;
    }